

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O3

TrodesMsg * new_TrodesMsg(TrodesMsg *__return_storage_ptr__,str *f,list *l)

{
  byte bVar1;
  uchar head;
  unsigned_short head_00;
  int head_01;
  uint head_02;
  _object *p_Var2;
  constructor_function head_03;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  constructor_function *pp_Var4;
  size_t __n;
  pointer puVar5;
  _Alloc_hider _Var7;
  ulong uVar8;
  object_cref2 x;
  undefined1 auVar9 [16];
  rvalue_from_python_stage1_data rVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> a;
  string format;
  int local_1ec;
  object_base local_1e8;
  object_base local_1e0;
  undefined1 local_1d8 [32];
  _object *local_1b8;
  undefined1 local_1b0 [8];
  rvalue_from_python_stage1_data local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  _object *local_170;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  string local_150;
  string local_130;
  long *local_110;
  int local_108;
  long local_100 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined8 uVar6;
  
  TrodesMsg::TrodesMsg(__return_storage_ptr__);
  p_Var2 = (f->super_str_base).super_object.super_object_base.m_ptr;
  local_1b8 = p_Var2;
  auVar9 = boost::python::converter::rvalue_from_python_stage1
                     (p_Var2,boost::python::converter::detail::
                             registered_base<std::__cxx11::string_const_volatile&>::converters);
  local_1a8.convertible = auVar9._0_8_;
  local_1a8.construct = auVar9._8_8_;
  pvVar3 = &local_198;
  if ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8.convertible != &local_198)
  {
    pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             boost::python::converter::rvalue_from_python_stage2
                       (p_Var2,&local_1a8,
                        boost::python::converter::detail::
                        registered_base<std::__cxx11::string_const_volatile&>::converters);
  }
  local_110 = local_100;
  puVar5 = (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,puVar5,
             (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + (long)puVar5);
  if (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8.convertible == &local_198)
     && ((pointer *)
         local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start !=
         &local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage)) {
    operator_delete(local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(local_198.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  local_1ec = 0;
  if (0 < local_108) {
    do {
      bVar1 = *(byte *)((long)local_110 + (long)local_1ec);
      if (bVar1 < 0x62) {
        switch(bVar1) {
        case 0x31:
          local_1d8._8_8_ =
               boost::python::api::object_initializer_impl<false,_false>::get<int>(&local_1ec);
          local_1d8._0_8_ = (l->super_list_base).super_object.super_object_base.m_ptr;
          ((PyObject *)local_1d8._0_8_)->ob_refcnt = ((PyObject *)local_1d8._0_8_)->ob_refcnt + 1;
          if (((PyObject *)local_1d8._8_8_)->ob_refcnt == 0) {
            _Py_Dealloc(local_1d8._8_8_);
          }
          boost::python::api::getitem
                    ((api *)&local_1e8,(object *)local_1d8,(object *)(local_1d8 + 8));
          local_1b8 = local_1e8.m_ptr;
          rVar10 = (rvalue_from_python_stage1_data)
                   boost::python::converter::rvalue_from_python_stage1
                             (local_1e8.m_ptr,
                              boost::python::converter::detail::
                              registered_base<unsigned_char_const_volatile&>::converters);
          pp_Var4 = &local_1a8.construct;
          _local_1b0 = rVar10;
          if ((constructor_function *)rVar10.convertible != pp_Var4) {
            pp_Var4 = (constructor_function *)
                      boost::python::converter::rvalue_from_python_stage2
                                (local_1b8,(rvalue_from_python_stage1_data *)local_1b0,
                                 boost::python::converter::detail::
                                 registered_base<unsigned_char_const_volatile&>::converters);
          }
          head = *(uchar *)pp_Var4;
          (local_1e8.m_ptr)->ob_refcnt = (local_1e8.m_ptr)->ob_refcnt + -1;
          if ((local_1e8.m_ptr)->ob_refcnt == 0) {
            _Py_Dealloc();
          }
          *(Py_ssize_t *)local_1d8._8_8_ = *(Py_ssize_t *)local_1d8._8_8_ + -1;
          if (*(Py_ssize_t *)local_1d8._8_8_ == 0) {
            _Py_Dealloc();
          }
          *(Py_ssize_t *)local_1d8._0_8_ = *(Py_ssize_t *)local_1d8._0_8_ + -1;
          if (*(Py_ssize_t *)local_1d8._0_8_ == 0) {
            _Py_Dealloc();
          }
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"1","");
          TrodesMsg::addcontents<unsigned_char>(__return_storage_ptr__,&local_70,head);
          uVar6 = local_70.field_2._M_allocated_capacity;
          _Var7._M_p = local_70._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_0022595c:
            puVar5 = (pointer)(uVar6 + 1);
LAB_0022595f:
            operator_delete(_Var7._M_p,(ulong)puVar5);
          }
          break;
        case 0x32:
          local_1d8._8_8_ =
               boost::python::api::object_initializer_impl<false,_false>::get<int>(&local_1ec);
          local_1d8._0_8_ = (l->super_list_base).super_object.super_object_base.m_ptr;
          ((PyObject *)local_1d8._0_8_)->ob_refcnt = ((PyObject *)local_1d8._0_8_)->ob_refcnt + 1;
          if (((PyObject *)local_1d8._8_8_)->ob_refcnt == 0) {
            _Py_Dealloc(local_1d8._8_8_);
          }
          boost::python::api::getitem
                    ((api *)&local_1e8,(object *)local_1d8,(object *)(local_1d8 + 8));
          local_1b8 = local_1e8.m_ptr;
          rVar10 = (rvalue_from_python_stage1_data)
                   boost::python::converter::rvalue_from_python_stage1
                             (local_1e8.m_ptr,
                              boost::python::converter::detail::
                              registered_base<unsigned_short_const_volatile&>::converters);
          pp_Var4 = &local_1a8.construct;
          _local_1b0 = rVar10;
          if ((constructor_function *)rVar10.convertible != pp_Var4) {
            pp_Var4 = (constructor_function *)
                      boost::python::converter::rvalue_from_python_stage2
                                (local_1b8,(rvalue_from_python_stage1_data *)local_1b0,
                                 boost::python::converter::detail::
                                 registered_base<unsigned_short_const_volatile&>::converters);
          }
          head_00 = *(unsigned_short *)pp_Var4;
          (local_1e8.m_ptr)->ob_refcnt = (local_1e8.m_ptr)->ob_refcnt + -1;
          if ((local_1e8.m_ptr)->ob_refcnt == 0) {
            _Py_Dealloc();
          }
          *(Py_ssize_t *)local_1d8._8_8_ = *(Py_ssize_t *)local_1d8._8_8_ + -1;
          if (*(Py_ssize_t *)local_1d8._8_8_ == 0) {
            _Py_Dealloc();
          }
          *(Py_ssize_t *)local_1d8._0_8_ = *(Py_ssize_t *)local_1d8._0_8_ + -1;
          if (*(Py_ssize_t *)local_1d8._0_8_ == 0) {
            _Py_Dealloc();
          }
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"2","");
          TrodesMsg::addcontents<unsigned_short>(__return_storage_ptr__,&local_90,head_00);
          uVar6 = local_90.field_2._M_allocated_capacity;
          _Var7._M_p = local_90._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_0022595c;
          break;
        case 0x34:
          local_1d8._8_8_ =
               boost::python::api::object_initializer_impl<false,_false>::get<int>(&local_1ec);
          local_1d8._0_8_ = (l->super_list_base).super_object.super_object_base.m_ptr;
          ((PyObject *)local_1d8._0_8_)->ob_refcnt = ((PyObject *)local_1d8._0_8_)->ob_refcnt + 1;
          if (((PyObject *)local_1d8._8_8_)->ob_refcnt == 0) {
            _Py_Dealloc(local_1d8._8_8_);
          }
          boost::python::api::getitem
                    ((api *)&local_1e8,(object *)local_1d8,(object *)(local_1d8 + 8));
          local_1b8 = local_1e8.m_ptr;
          rVar10 = (rvalue_from_python_stage1_data)
                   boost::python::converter::rvalue_from_python_stage1
                             (local_1e8.m_ptr,
                              boost::python::converter::detail::
                              registered_base<unsigned_int_const_volatile&>::converters);
          pp_Var4 = &local_1a8.construct;
          _local_1b0 = rVar10;
          if ((constructor_function *)rVar10.convertible != pp_Var4) {
            pp_Var4 = (constructor_function *)
                      boost::python::converter::rvalue_from_python_stage2
                                (local_1b8,(rvalue_from_python_stage1_data *)local_1b0,
                                 boost::python::converter::detail::
                                 registered_base<unsigned_int_const_volatile&>::converters);
          }
          head_02 = *(uint *)pp_Var4;
          (local_1e8.m_ptr)->ob_refcnt = (local_1e8.m_ptr)->ob_refcnt + -1;
          if ((local_1e8.m_ptr)->ob_refcnt == 0) {
            _Py_Dealloc();
          }
          *(Py_ssize_t *)local_1d8._8_8_ = *(Py_ssize_t *)local_1d8._8_8_ + -1;
          if (*(Py_ssize_t *)local_1d8._8_8_ == 0) {
            _Py_Dealloc();
          }
          *(Py_ssize_t *)local_1d8._0_8_ = *(Py_ssize_t *)local_1d8._0_8_ + -1;
          if (*(Py_ssize_t *)local_1d8._0_8_ == 0) {
            _Py_Dealloc();
          }
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"4","");
          TrodesMsg::addcontents<unsigned_int>(__return_storage_ptr__,&local_b0,head_02);
          uVar6 = local_b0.field_2._M_allocated_capacity;
          _Var7._M_p = local_b0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_0022595c;
          break;
        case 0x38:
          local_1d8._8_8_ =
               boost::python::api::object_initializer_impl<false,_false>::get<int>(&local_1ec);
          local_1d8._0_8_ = (l->super_list_base).super_object.super_object_base.m_ptr;
          ((PyObject *)local_1d8._0_8_)->ob_refcnt = ((PyObject *)local_1d8._0_8_)->ob_refcnt + 1;
          if (((PyObject *)local_1d8._8_8_)->ob_refcnt == 0) {
            _Py_Dealloc(local_1d8._8_8_);
          }
          boost::python::api::getitem
                    ((api *)&local_1e8,(object *)local_1d8,(object *)(local_1d8 + 8));
          local_1b8 = local_1e8.m_ptr;
          rVar10 = (rvalue_from_python_stage1_data)
                   boost::python::converter::rvalue_from_python_stage1
                             (local_1e8.m_ptr,
                              boost::python::converter::detail::
                              registered_base<unsigned_long_const_volatile&>::converters);
          pp_Var4 = &local_1a8.construct;
          _local_1b0 = rVar10;
          if ((constructor_function *)rVar10.convertible != pp_Var4) {
            pp_Var4 = (constructor_function *)
                      boost::python::converter::rvalue_from_python_stage2
                                (local_1b8,(rvalue_from_python_stage1_data *)local_1b0,
                                 boost::python::converter::detail::
                                 registered_base<unsigned_long_const_volatile&>::converters);
          }
          head_03 = *pp_Var4;
          (local_1e8.m_ptr)->ob_refcnt = (local_1e8.m_ptr)->ob_refcnt + -1;
          if ((local_1e8.m_ptr)->ob_refcnt == 0) {
            _Py_Dealloc();
          }
          *(Py_ssize_t *)local_1d8._8_8_ = *(Py_ssize_t *)local_1d8._8_8_ + -1;
          if (*(Py_ssize_t *)local_1d8._8_8_ == 0) {
            _Py_Dealloc();
          }
          *(Py_ssize_t *)local_1d8._0_8_ = *(Py_ssize_t *)local_1d8._0_8_ + -1;
          if (*(Py_ssize_t *)local_1d8._0_8_ == 0) {
            _Py_Dealloc();
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"8","");
          TrodesMsg::addcontents<unsigned_long>
                    (__return_storage_ptr__,&local_d0,(unsigned_long)head_03);
          uVar6 = local_d0.field_2._M_allocated_capacity;
          _Var7._M_p = local_d0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_0022595c;
        }
      }
      else if (bVar1 == 0x62) {
        local_1e0.m_ptr =
             boost::python::api::object_initializer_impl<false,_false>::get<int>(&local_1ec);
        local_1e8.m_ptr = (l->super_list_base).super_object.super_object_base.m_ptr;
        (local_1e8.m_ptr)->ob_refcnt = (local_1e8.m_ptr)->ob_refcnt + 1;
        if ((local_1e0.m_ptr)->ob_refcnt == 0) {
          _Py_Dealloc(local_1e0.m_ptr);
        }
        boost::python::api::getitem((api *)&local_170,(object *)&local_1e8,(object *)&local_1e0);
        local_1b8 = local_170;
        rVar10 = (rvalue_from_python_stage1_data)
                 boost::python::converter::rvalue_from_python_stage1
                           (local_170,
                            boost::python::converter::detail::
                            registered_base<std::vector<unsigned_char,std::allocator<unsigned_char>>const_volatile&>
                            ::converters);
        pvVar3 = &local_198;
        local_1a8 = rVar10;
        if ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)rVar10.convertible != pvVar3) {
          pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   boost::python::converter::rvalue_from_python_stage2
                             (local_1b8,&local_1a8,
                              boost::python::converter::detail::
                              registered_base<std::vector<unsigned_char,std::allocator<unsigned_char>>const_volatile&>
                              ::converters);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,pvVar3);
        if (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8.convertible ==
             &local_198) &&
           (local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_198.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_198.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_170->ob_refcnt = local_170->ob_refcnt + -1;
        if (local_170->ob_refcnt == 0) {
          _Py_Dealloc();
        }
        (local_1e0.m_ptr)->ob_refcnt = (local_1e0.m_ptr)->ob_refcnt + -1;
        if ((local_1e0.m_ptr)->ob_refcnt == 0) {
          _Py_Dealloc();
        }
        (local_1e8.m_ptr)->ob_refcnt = (local_1e8.m_ptr)->ob_refcnt + -1;
        if ((local_1e8.m_ptr)->ob_refcnt == 0) {
          _Py_Dealloc();
        }
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"b","");
        local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar8 = local_1d8._8_8_ - local_1d8._0_8_;
        if (uVar8 == 0) {
          puVar5 = (pointer)0x0;
          __n = 0;
        }
        else {
          if ((long)uVar8 < 0) {
            std::__throw_bad_alloc();
          }
          puVar5 = (pointer)operator_new(uVar8);
          __n = local_1d8._8_8_ - local_1d8._0_8_;
        }
        local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar5 + uVar8;
        local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = puVar5;
        if (local_1d8._8_8_ != local_1d8._0_8_) {
          local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar5;
          memmove(puVar5,(void *)local_1d8._0_8_,__n);
        }
        local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5 + __n;
        TrodesMsg::addcontents<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  (__return_storage_ptr__,&local_150,&local_168);
        if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_168.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_168.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_168.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((PyObject *)local_1d8._0_8_ != (PyObject *)0x0) {
          puVar5 = (pointer)(local_1d8._16_8_ + -local_1d8._0_8_);
          _Var7._M_p = (pointer)local_1d8._0_8_;
          goto LAB_0022595f;
        }
      }
      else if (bVar1 == 0x73) {
        local_1e0.m_ptr =
             boost::python::api::object_initializer_impl<false,_false>::get<int>(&local_1ec);
        local_1e8.m_ptr = (l->super_list_base).super_object.super_object_base.m_ptr;
        (local_1e8.m_ptr)->ob_refcnt = (local_1e8.m_ptr)->ob_refcnt + 1;
        if ((local_1e0.m_ptr)->ob_refcnt == 0) {
          _Py_Dealloc(local_1e0.m_ptr);
        }
        boost::python::api::getitem((api *)&local_170,(object *)&local_1e8,(object *)&local_1e0);
        local_1b8 = local_170;
        auVar9 = boost::python::converter::rvalue_from_python_stage1
                           (local_170,
                            boost::python::converter::detail::
                            registered_base<std::__cxx11::string_const_volatile&>::converters);
        local_1a8.convertible = auVar9._0_8_;
        local_1a8.construct = auVar9._8_8_;
        pvVar3 = &local_198;
        if ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8.convertible != pvVar3
           ) {
          pvVar3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   boost::python::converter::rvalue_from_python_stage2
                             (local_1b8,&local_1a8,
                              boost::python::converter::detail::
                              registered_base<std::__cxx11::string_const_volatile&>::converters);
        }
        local_1d8._0_8_ = local_1d8 + 0x10;
        puVar5 = (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d8,puVar5,
                   (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish + (long)puVar5);
        if (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8.convertible ==
             &local_198) &&
           ((pointer *)
            local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_198.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage)) {
          operator_delete(local_198.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(local_198.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        local_170->ob_refcnt = local_170->ob_refcnt + -1;
        if (local_170->ob_refcnt == 0) {
          _Py_Dealloc();
        }
        (local_1e0.m_ptr)->ob_refcnt = (local_1e0.m_ptr)->ob_refcnt + -1;
        if ((local_1e0.m_ptr)->ob_refcnt == 0) {
          _Py_Dealloc();
        }
        (local_1e8.m_ptr)->ob_refcnt = (local_1e8.m_ptr)->ob_refcnt + -1;
        if ((local_1e8.m_ptr)->ob_refcnt == 0) {
          _Py_Dealloc();
        }
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"s","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_1d8._0_8_,
                   (long)(Py_ssize_t *)local_1d8._8_8_ + local_1d8._0_8_);
        TrodesMsg::addcontents<std::__cxx11::string>(__return_storage_ptr__,&local_130,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        uVar6 = local_1d8._16_8_;
        _Var7._M_p = (pointer)local_1d8._0_8_;
        if ((PyObject *)local_1d8._0_8_ != (PyObject *)(local_1d8 + 0x10)) goto LAB_0022595c;
      }
      else if (bVar1 == 0x69) {
        local_1d8._8_8_ =
             boost::python::api::object_initializer_impl<false,_false>::get<int>(&local_1ec);
        local_1d8._0_8_ = (l->super_list_base).super_object.super_object_base.m_ptr;
        ((PyObject *)local_1d8._0_8_)->ob_refcnt = ((PyObject *)local_1d8._0_8_)->ob_refcnt + 1;
        if (((PyObject *)local_1d8._8_8_)->ob_refcnt == 0) {
          _Py_Dealloc(local_1d8._8_8_);
        }
        boost::python::api::getitem((api *)&local_1e8,(object *)local_1d8,(object *)(local_1d8 + 8))
        ;
        local_1b8 = local_1e8.m_ptr;
        rVar10 = (rvalue_from_python_stage1_data)
                 boost::python::converter::rvalue_from_python_stage1
                           (local_1e8.m_ptr,
                            boost::python::converter::detail::registered_base<int_const_volatile&>::
                            converters);
        pp_Var4 = &local_1a8.construct;
        _local_1b0 = rVar10;
        if ((constructor_function *)rVar10.convertible != pp_Var4) {
          pp_Var4 = (constructor_function *)
                    boost::python::converter::rvalue_from_python_stage2
                              (local_1b8,(rvalue_from_python_stage1_data *)local_1b0,
                               boost::python::converter::detail::
                               registered_base<int_const_volatile&>::converters);
        }
        head_01 = *(int *)pp_Var4;
        (local_1e8.m_ptr)->ob_refcnt = (local_1e8.m_ptr)->ob_refcnt + -1;
        if ((local_1e8.m_ptr)->ob_refcnt == 0) {
          _Py_Dealloc();
        }
        *(Py_ssize_t *)local_1d8._8_8_ = *(Py_ssize_t *)local_1d8._8_8_ + -1;
        if (*(Py_ssize_t *)local_1d8._8_8_ == 0) {
          _Py_Dealloc();
        }
        *(Py_ssize_t *)local_1d8._0_8_ = *(Py_ssize_t *)local_1d8._0_8_ + -1;
        if (*(Py_ssize_t *)local_1d8._0_8_ == 0) {
          _Py_Dealloc();
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"i","");
        TrodesMsg::addcontents<int>(__return_storage_ptr__,&local_50,head_01);
        uVar6 = local_50.field_2._M_allocated_capacity;
        _Var7._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0022595c;
      }
      local_1ec = local_1ec + 1;
    } while (local_1ec < local_108);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

TrodesMsg new_TrodesMsg(str f, list& l){
    TrodesMsg msg;
    std::string format = extract<std::string>(f);
    int strl = format.length();
    for(int i = 0; i < strl; i++){
        switch (format[i]){
        case 'i':{
            int a = extract<int>(l[i]);
            msg.addcontents("i", a);
            break;}
        case '1':{
            uint8_t a = extract<uint8_t>(l[i]);
            msg.addcontents("1", a);
            break;}
        case '2':{
            uint16_t a = extract<uint16_t>(l[i]);
            msg.addcontents("2", a);
            break;}
        case '4':{
            uint32_t a = extract<uint32_t>(l[i]);
            msg.addcontents("4", a);
            break;}
        case '8':{
            uint64_t a = extract<uint64_t>(l[i]);
            msg.addcontents("8", a);
            break;}
        case 's':{
            std::string a = extract<std::string>(l[i]);
            msg.addcontents("s", a);
            break;}
        case 'b':{
            std::vector<byte> a = extract<std::vector<byte> >(l[i]);
            msg.addcontents("b", a);
            break;}
//            case 'n':{
//                NetworkDataType a;
//                msg.popcontents("n", a);
//                l.append(a);
//                break;}
        default:
            break;
        }
    }
    return msg;
}